

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O0

void __thiscall L13_2::BankAccountPlus::withdraw(BankAccountPlus *this,double amount)

{
  format f;
  streamsize p;
  ostream *poVar1;
  void *pvVar2;
  double dVar3;
  double loan;
  double balance;
  precis initPrec;
  format initState;
  double amount_local;
  BankAccountPlus *this_local;
  
  f = set_format();
  p = std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  dVar3 = (this->super_BankAccount)._balance;
  if (dVar3 <= amount) {
    if ((dVar3 + this->_max_loan) - this->_loan <= amount) {
      std::operator<<((ostream *)&std::cout,"Credit limit exceeded, Transaction aborted.\n");
    }
    else {
      dVar3 = amount - dVar3;
      this->_loan = dVar3 * (this->_rate + 1.0) + this->_loan;
      poVar1 = std::operator<<((ostream *)&std::cout,"credit loan amount: $");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"credit loan charge: $");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar3 * this->_rate);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      BankAccount::deposit(&this->super_BankAccount,dVar3);
      BankAccount::withdraw(&this->super_BankAccount,amount);
    }
  }
  else {
    BankAccount::withdraw(&this->super_BankAccount,amount);
  }
  reset_format(f,p);
  return;
}

Assistant:

void BankAccountPlus::withdraw(double amount) {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  当前余额
//        double balance = get_balance();
        //  access through protected member
        double balance = _balance;
        if (amount < balance) {
            BankAccount::withdraw(amount);
        } else if (amount < balance + _max_loan - _loan) {
            //  取款同时进行信用贷款
            double loan = amount - balance;
            _loan += loan * (1.0 + _rate);
            cout << "credit loan amount: $" << loan << endl;
            cout << "credit loan charge: $" << loan * _rate << endl;
            //  先把不够的部分存进去
            deposit(loan);
            //  再取出来总的借贷额
            BankAccount::withdraw(amount);
        } else {
            cout << "Credit limit exceeded, Transaction aborted.\n";
        }

        reset_format(initState, initPrec);
    }